

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O2

Matrix33d * gmath::inv(Matrix33d *__return_storage_ptr__,Matrix33d *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = det<double>(a);
  dVar10 = 1.0 / dVar10;
  SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  dVar1 = a->v[1][1];
  dVar4 = a->v[2][1];
  dVar5 = a->v[2][2];
  dVar6 = a->v[1][2];
  dVar7 = a->v[2][0];
  dVar2 = a->v[0][1];
  dVar8 = a->v[0][2];
  dVar9 = a->v[1][0];
  __return_storage_ptr__->v[0][0] = (dVar1 * dVar5 - dVar4 * dVar6) * dVar10;
  __return_storage_ptr__->v[0][1] = (dVar8 * dVar4 - dVar5 * dVar2) * dVar10;
  __return_storage_ptr__->v[0][2] = (dVar2 * dVar6 - dVar1 * dVar8) * dVar10;
  __return_storage_ptr__->v[1][0] = (dVar6 * dVar7 - dVar5 * dVar9) * dVar10;
  dVar3 = a->v[0][0];
  __return_storage_ptr__->v[1][1] = (-dVar8 * dVar7 + dVar5 * dVar3) * dVar10;
  __return_storage_ptr__->v[1][2] = (-dVar3 * dVar6 + dVar9 * dVar8) * dVar10;
  __return_storage_ptr__->v[2][0] = (dVar4 * dVar9 - dVar7 * dVar1) * dVar10;
  __return_storage_ptr__->v[2][1] = (dVar7 * dVar2 - dVar4 * dVar3) * dVar10;
  __return_storage_ptr__->v[2][2] = (dVar3 * dVar1 + -dVar2 * dVar9) * dVar10;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d inv(const Matrix33d &a)
{
  double d=det(a);

  assert(d != 0);

  d=1.0/d;

  Matrix33d ret;

  ret(0, 0)=d*(a(1, 1)*a(2, 2)-a(1, 2)*a(2, 1));
  ret(0, 1)=d*(a(0, 2)*a(2, 1)-a(0, 1)*a(2, 2));
  ret(0, 2)=d*(a(0, 1)*a(1, 2)-a(0, 2)*a(1, 1));

  ret(1, 0)=d*(a(1, 2)*a(2, 0)-a(1, 0)*a(2, 2));
  ret(1, 1)=d*(a(0, 0)*a(2, 2)-a(0, 2)*a(2, 0));
  ret(1, 2)=d*(a(0, 2)*a(1, 0)-a(0, 0)*a(1, 2));

  ret(2, 0)=d*(a(1, 0)*a(2, 1)-a(1, 1)*a(2, 0));
  ret(2, 1)=d*(a(0, 1)*a(2, 0)-a(0, 0)*a(2, 1));
  ret(2, 2)=d*(a(0, 0)*a(1, 1)-a(0, 1)*a(1, 0));

  return ret;
}